

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

bool __thiscall
OPNMIDIplay::realTime_NoteOn(OPNMIDIplay *this,uint8_t channel,uint8_t note,uint8_t velocity)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  reference this_00;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar5;
  int *piVar6;
  size_type sVar7;
  char *pcVar8;
  value_type *pvVar9;
  uint *puVar10;
  size_type sVar11;
  Phys *this_01;
  reference pOVar12;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined4 uVar15;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 uVar13;
  undefined8 extraout_XMM0_Qa_06;
  double dVar14;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar16;
  byte local_292;
  byte local_291;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_290;
  byte local_281;
  int local_274;
  uint local_264;
  int32_t c_2;
  uint ccount_2;
  uint uStack_250;
  uint16_t chipChan;
  int32_t c_1;
  uint ccount_1;
  bool portamentoEnable;
  double currentPortamentoRate;
  int8_t currentPortamentoSource;
  NoteInfo *ni;
  notes_iterator ir;
  int64_t s;
  size_t a;
  int local_210;
  int32_t bs;
  int32_t c;
  uint32_t ccount;
  int32_t adlchannel [2];
  NoteInfo *dummy;
  notes_iterator i_1;
  ulong local_1e0;
  ulong local_1d8;
  byte local_1c9;
  undefined1 local_1c8 [7];
  bool isBlankNote;
  Phys voices [2];
  ulong local_168;
  ulong local_160;
  uint local_154;
  int local_150;
  int32_t tone;
  int local_148;
  int local_144;
  undefined1 local_140 [4];
  int veloffset;
  undefined1 local_128 [8];
  iterator b_2;
  char *text;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *missing;
  undefined1 local_d8 [8];
  iterator b_1;
  size_t fallback;
  undefined1 local_a0 [8];
  iterator b;
  Bank *pBStack_80;
  bool caughtMissingBank;
  Bank *bnk;
  OpnInstMeta *ains;
  size_t bank;
  OpnInstMeta *pOStack_60;
  bool isPercussion;
  size_t midiins;
  MIDIchannel *midiChan;
  int local_48 [4];
  NoteInfo *pNStack_38;
  int veloffset_1;
  NoteInfo *ni_1;
  notes_iterator i;
  Synth *synth;
  uint8_t velocity_local;
  uint8_t note_local;
  uint8_t channel_local;
  OPNMIDIplay *this_local;
  
  i.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
            AdlMIDI_UPtr<OPN2,_ADLMIDI_DefaultDelete<OPN2>_>::operator*(&this->m_synth);
  synth._6_1_ = note;
  if (0x7e < note) {
    synth._6_1_ = 0x7f;
  }
  if ((((OPN2 *)i.cell_)->m_musicMode == MODE_RSXX) && (velocity != '\0')) {
    this_00 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
              operator[](&this->m_midiChannels,(ulong)channel);
    ni_1 = (NoteInfo *)MIDIchannel::find_activenote(this_00,(uint)synth._6_1_);
    bVar3 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::is_end
                      ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&ni_1);
    if (!bVar3) {
      ppVar5 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::operator->
                         ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&ni_1);
      pNStack_38 = &ppVar5->value;
      if ((ppVar5->value).ains == (OpnInstMeta *)0x0) {
        local_274 = 0;
      }
      else {
        local_274 = (int)((ppVar5->value).ains)->midiVelocityOffset;
      }
      local_48[3] = local_274;
      local_48[2] = 0x7f;
      local_48[1] = 1;
      local_48[0] = (uint)velocity + local_274;
      piVar6 = std::max<int>(local_48 + 1,local_48);
      piVar6 = std::min<int>(local_48 + 2,piVar6);
      pNStack_38->vol = (uint8_t)*piVar6;
      if (pNStack_38->ains != (OpnInstMeta *)0x0) {
        midiChan = (MIDIchannel *)ni_1;
        noteUpdate(this,(ulong)channel,(notes_iterator)ni_1,4,-1);
      }
      return false;
    }
  }
  sVar7 = std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::size
                    (&this->m_midiChannels);
  synth._7_1_ = channel;
  if (sVar7 < channel) {
    synth._7_1_ = channel % 0x10;
  }
  noteOff(this,(ulong)synth._7_1_,synth._6_1_,velocity != '\0');
  if (velocity == '\0') {
    this_local._7_1_ = false;
  }
  else {
    midiins = (size_t)std::
                      vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::
                      operator[](&this->m_midiChannels,(ulong)synth._7_1_);
    pOStack_60 = (OpnInstMeta *)(ulong)((reference)midiins)->patch;
    local_281 = 1;
    if ((uint)synth._7_1_ % 0x10 != 9) {
      local_281 = ((reference)midiins)->is_xg_percussion;
    }
    bank._7_1_ = local_281 & 1;
    ains = (OpnInstMeta *)0x0;
    if ((((reference)midiins)->bank_msb != '\0') || (((reference)midiins)->bank_lsb != '\0')) {
      if ((this->m_synthMode & 1) == 0) {
        iVar4 = (uint)((reference)midiins)->bank_msb * 0x100 + (uint)((reference)midiins)->bank_lsb;
      }
      else {
        iVar4 = (uint)((reference)midiins)->bank_msb << 8;
      }
      ains = (OpnInstMeta *)(long)iVar4;
    }
    if (bank._7_1_ != 0) {
      ains = pOStack_60;
      if ((this->m_synthMode & 2) != 0) {
        iVar4 = 0;
        if (((reference)midiins)->bank_msb == '~') {
          iVar4 = 0x80;
        }
        ains = (OpnInstMeta *)(pOStack_60->op[0].OPS[0].data + iVar4);
      }
      pOStack_60 = (OpnInstMeta *)(ulong)synth._6_1_;
    }
    if (bank._7_1_ != 0) {
      ains = (OpnInstMeta *)&ains[0x19e].op[1].noteOffset;
    }
    bnk = (Bank *)&OPN2::m_emptyInstrument;
    pBStack_80 = (Bank *)0x0;
    b.index._7_1_ = 0;
    if (((ulong)ains & 0xffffffffffff7fff) != 0) {
      BasicBankMap<OPN2::Bank>::find
                ((iterator *)local_a0,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5),(key_type)ains);
      BasicBankMap<OPN2::Bank>::end
                ((iterator *)&fallback,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5));
      bVar3 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                        ((iterator *)local_a0,(iterator *)&fallback);
      if (bVar3) {
        pvVar9 = BasicBankMap<OPN2::Bank>::iterator::operator->((iterator *)local_a0);
        pBStack_80 = &pvVar9->second;
      }
      if (pBStack_80 == (Bank *)0x0) {
        b.index._7_1_ = 1;
      }
      else {
        bnk = (Bank *)(pBStack_80->ins + (long)pOStack_60);
      }
    }
    if (((bnk->ins[0].flags & 2) != 0) &&
       (b_1.index = (ulong)ains & 0xffffffffffffff80, (OpnInstMeta *)b_1.index != ains)) {
      BasicBankMap<OPN2::Bank>::find
                ((iterator *)local_d8,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5),b_1.index);
      b.index._7_1_ = 0;
      BasicBankMap<OPN2::Bank>::end
                ((iterator *)&missing,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5));
      bVar3 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                        ((iterator *)local_d8,(iterator *)&missing);
      if (bVar3) {
        pvVar9 = BasicBankMap<OPN2::Bank>::iterator::operator->((iterator *)local_d8);
        pBStack_80 = &pvVar9->second;
      }
      if (pBStack_80 == (Bank *)0x0) {
        b.index._7_1_ = 1;
      }
      else {
        bnk = (Bank *)(pBStack_80->ins + (long)pOStack_60);
      }
    }
    if (((b.index._7_1_ & 1) != 0) && ((this->hooks).onDebugMessage != (DebugMessageHook)0x0)) {
      if ((bank._7_1_ & 1) == 0) {
        local_290 = &this->caugh_missing_banks_melodic;
      }
      else {
        local_290 = &this->caugh_missing_banks_percussion;
      }
      pcVar8 = "melodic";
      if ((bank._7_1_ & 1) != 0) {
        pcVar8 = "percussion";
      }
      pVar16 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert(local_290,(value_type_conflict4 *)&ains);
      b_2.index = (size_t)pVar16.first._M_node;
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (*(this->hooks).onDebugMessage)
                  ((this->hooks).onDebugMessage_userData,
                   "[%i] Playing missing %s MIDI bank %i (patch %i)",(ulong)synth._7_1_,pcVar8,
                   (ulong)ains & 0xffffffffffff7fff,pOStack_60);
      }
    }
    if ((bnk->ins[0].flags & 2) != 0) {
      BasicBankMap<OPN2::Bank>::find
                ((iterator *)local_128,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5),(ulong)ains & 0x8000);
      BasicBankMap<OPN2::Bank>::end
                ((iterator *)local_140,
                 (BasicBankMap<OPN2::Bank> *)
                 (((i.cell_)->value).chip_channels[1].ains.OPS[1].data + 5));
      bVar3 = BasicBankMap<OPN2::Bank>::iterator::operator!=
                        ((iterator *)local_128,(iterator *)local_140);
      if (bVar3) {
        pvVar9 = BasicBankMap<OPN2::Bank>::iterator::operator->((iterator *)local_128);
        pBStack_80 = &pvVar9->second;
      }
      if (pBStack_80 != (Bank *)0x0) {
        bnk = (Bank *)(pBStack_80->ins + (long)pOStack_60);
      }
    }
    local_144 = (int)bnk->ins[0].midiVelocityOffset;
    local_148 = 0x7f;
    tone = 1;
    local_150 = (uint)velocity + local_144;
    piVar6 = std::max<int>(&tone,&local_150);
    puVar10 = (uint *)std::min<int>(&local_148,piVar6);
    uVar2 = *puVar10;
    synth._5_1_ = (uint8_t)uVar2;
    local_154 = (uint)synth._6_1_;
    uVar13 = extraout_XMM0_Qa;
    if ((((bank._7_1_ & 1) == 0) && (ains != (OpnInstMeta *)0x0)) && ((bnk->ins[0].flags & 2) != 0))
    {
      if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
        local_160 = (ulong)pOStack_60 & 0xff;
        sVar11 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 count(&this->caugh_missing_instruments,&local_160);
        uVar13 = extraout_XMM0_Qa_00;
        if (sVar11 == 0) {
          (*(this->hooks).onDebugMessage)
                    ((this->hooks).onDebugMessage_userData,
                     "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u",
                     (ulong)synth._7_1_,(ulong)*(byte *)(midiins + 0xe),pOStack_60,ains);
          local_168 = (ulong)pOStack_60 & 0xff;
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (&this->caugh_missing_instruments,&local_168);
          uVar13 = extraout_XMM0_Qa_01;
        }
      }
      ains = (OpnInstMeta *)0x0;
      pOStack_60 = (OpnInstMeta *)(ulong)*(byte *)(midiins + 0xe);
    }
    if (bnk->ins[0].drumTone != '\0') {
      if (bnk->ins[0].drumTone < 0x80) {
        local_154 = (uint)bnk->ins[0].drumTone;
      }
      else {
        local_154 = bnk->ins[0].drumTone - 0x80;
      }
    }
    local_1c8._0_2_ = 0;
    unique0x00012000 = *(undefined8 *)bnk->ins[0].op[0].OPS;
    voices[0].ains.OPS._0_8_ = *(undefined8 *)(bnk->ins[0].op[0].OPS[1].data + 1);
    voices[0].ains.OPS._8_8_ = *(undefined8 *)(bnk->ins[0].op[0].OPS[2].data + 2);
    voices[0].ains.OPS._16_8_ = *(undefined8 *)(bnk->ins[0].op[0].OPS[3].data + 3);
    voices[0].ains.OPS[3].data[3] = '\0';
    voices[0].ains.OPS[3].data[4] = '\0';
    voices._28_8_ = *(undefined8 *)bnk->ins[0].op[1].OPS;
    voices[1].ains.OPS._0_8_ = *(undefined8 *)(bnk->ins[0].op[1].OPS[1].data + 1);
    voices[1].ains.OPS._8_8_ = *(undefined8 *)(bnk->ins[0].op[1].OPS[2].data + 2);
    voices[1].ains.OPS._16_8_ = *(undefined8 *)(bnk->ins[0].op[1].OPS[3].data + 3);
    local_1c9 = (bnk->ins[0].flags & 2) != 0;
    if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
      local_1d8 = (ulong)pOStack_60 & 0xff;
      sVar11 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               count(&this->caugh_missing_instruments,&local_1d8);
      local_291 = 0;
      if (sVar11 == 0) {
        local_291 = local_1c9;
      }
      uVar13 = extraout_XMM0_Qa_02;
      if ((local_291 & 1) != 0) {
        (*(this->hooks).onDebugMessage)
                  ((this->hooks).onDebugMessage_userData,"[%i] Playing missing instrument %i",
                   (ulong)synth._7_1_,pOStack_60);
        local_1e0 = (ulong)pOStack_60 & 0xff;
        pVar16 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 insert(&this->caugh_missing_instruments,&local_1e0);
        i_1.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)pVar16.first._M_node;
        uVar13 = extraout_XMM0_Qa_03;
      }
    }
    if ((local_1c9 & 1) == 0) {
      _c = -1;
      for (bs = 0; uVar15 = (undefined4)((ulong)uVar13 >> 0x20), (uint)bs < 2; bs = bs + 1) {
        if (bs == 1) {
          bVar3 = MIDIchannel::NoteInfo::Phys::operator==
                            ((Phys *)local_1c8,(Phys *)(voices[0].ains.OPS[3].data + 3));
          uVar15 = (undefined4)((ulong)extraout_XMM0_Qa_04 >> 0x20);
          if ((bVar3) || (uVar13 = extraout_XMM0_Qa_04, c == -1)) break;
        }
        local_210 = -1;
        a._4_4_ = -0x7fffffff;
        for (s = 0; (ulong)s <
                    (ulong)*(uint *)&((i.cell_)->
                                     super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).prev;
            s = s + 1) {
          if (((bs != 1) || ((int)s != c)) &&
             (ir.cell_ = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
                         calculateChipChannelGoodness
                                   (this,s,(Phys *)(local_1c8 + (ulong)(uint)bs * 0x22)),
             uVar13 = extraout_XMM0_Qa_05, (long)a._4_4_ < (long)ir.cell_)) {
            a._4_4_ = (int)ir.cell_;
            local_210 = (int)s;
          }
        }
        if (local_210 < 0) {
          if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
            uVar13 = (*(this->hooks).onDebugMessage)
                               ((this->hooks).onDebugMessage_userData,
                                "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]"
                                ,ains,(ulong)*(byte *)(midiins + 0xe),(ulong)synth._6_1_,
                                (ulong)synth._7_1_);
          }
        }
        else {
          prepareChipChannelForNewNote
                    (this,(long)local_210,(Phys *)(local_1c8 + (ulong)(uint)bs * 0x22));
          (&c)[(uint)bs] = local_210;
          uVar13 = extraout_XMM0_Qa_06;
        }
      }
      if ((c < 0) && (_c < 0)) {
        this_local._7_1_ = false;
      }
      else {
        if ((*(byte *)(midiins + 0x17) & 1) != 0) {
          dVar14 = std::floor((double)CONCAT44(uVar15,(float)(uVar2 & 0xff) * 0.8));
          synth._5_1_ = (uint8_t)(int)SUB84(dVar14,0);
        }
        ni = (NoteInfo *)
             MIDIchannel::ensure_find_or_create_activenote((MIDIchannel *)midiins,(uint)synth._6_1_)
        ;
        ppVar5 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::operator->
                           ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&ni);
        (ppVar5->value).vol = synth._5_1_;
        (ppVar5->value).vibrato = *(uint8_t *)(midiins + 0x28 + (ulong)synth._6_1_);
        (ppVar5->value).noteTone = (int16_t)local_154;
        (ppVar5->value).currentTone = (double)(int)local_154;
        (ppVar5->value).glideRate = INFINITY;
        (ppVar5->value).midiins = (size_t)pOStack_60;
        (ppVar5->value).isPercussion = (bool)(bank._7_1_ & 1);
        (ppVar5->value).isBlank = (bool)(local_1c9 & 1);
        (ppVar5->value).isOnExtendedLifeTime = false;
        (ppVar5->value).ttl = 0.0;
        (ppVar5->value).ains = bnk->ins;
        (ppVar5->value).chip_channels_count = 0;
        cVar1 = *(char *)(midiins + 0x19);
        dVar14 = *(double *)(midiins + 0x20);
        local_292 = 0;
        if ((*(byte *)(midiins + 0x18) & 1) != 0) {
          local_292 = 0;
          if ((dVar14 != INFINITY) || (NAN(dVar14))) {
            local_292 = bank._7_1_ ^ 0xff;
          }
        }
        *(byte *)(midiins + 0x19) = synth._6_1_;
        if (((local_292 & 1) != 0) && (-1 < cVar1)) {
          (ppVar5->value).currentTone = (double)(int)cVar1;
          (ppVar5->value).glideRate = dVar14;
          *(int *)(midiins + 0xf4) = *(int *)(midiins + 0xf4) + 1;
        }
        if ((bank._7_1_ & 1) != 0) {
          (ppVar5->value).ttl = 0.03;
          *(int *)(midiins + 0xf8) = *(int *)(midiins + 0xf8) + 1;
        }
        for (uStack_250 = 0; uStack_250 < 2; uStack_250 = uStack_250 + 1) {
          if (-1 < (&c)[uStack_250]) {
            this_01 = MIDIchannel::NoteInfo::phys_ensure_find_or_create
                                (&ppVar5->value,(uint16_t)(&c)[uStack_250]);
            MIDIchannel::NoteInfo::Phys::assign
                      (this_01,(Phys *)(local_1c8 + (ulong)uStack_250 * 0x22));
          }
        }
        noteUpdate(this,(ulong)synth._7_1_,(notes_iterator)ni,0xf,-1);
        for (local_264 = 0; local_264 < 2; local_264 = local_264 + 1) {
          iVar4 = (&c)[local_264];
          if (-1 < iVar4) {
            pOVar12 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                      ::operator[](&this->m_chipChannels,(long)iVar4);
            memcpy(&pOVar12->recent_ins,local_1c8 + (ulong)local_264 * 0x22,0x22);
            pOVar12 = std::vector<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                      ::operator[](&this->m_chipChannels,(long)iVar4);
            OpnChannel::addAge(pOVar12,0);
          }
        }
        this_local._7_1_ = true;
      }
    }
    else {
      dummy = (NoteInfo *)
              MIDIchannel::ensure_find_or_create_activenote
                        ((MIDIchannel *)midiins,(uint)synth._6_1_);
      ppVar5 = pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_>::operator->
                         ((pl_iterator<pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo>_> *)&dummy);
      (ppVar5->value).isBlank = true;
      (ppVar5->value).isOnExtendedLifeTime = false;
      (ppVar5->value).ttl = 0.0;
      (ppVar5->value).ains = (OpnInstMeta *)0x0;
      (ppVar5->value).chip_channels_count = 0;
      *(byte *)(midiins + 0x19) = synth._6_1_;
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OPNMIDIplay::realTime_NoteOn(uint8_t channel, uint8_t note, uint8_t velocity)
{
    Synth &synth = *m_synth;

    if(note >= 127)
        note = 127;

    if((synth.m_musicMode == Synth::MODE_RSXX) && (velocity != 0))
    {
        // Check if this is just a note after-touch
        MIDIchannel::notes_iterator i = m_midiChannels[channel].find_activenote(note);
        if(!i.is_end())
        {
            MIDIchannel::NoteInfo &ni = i->value;
            const int veloffset = ni.ains ? ni.ains->midiVelocityOffset : 0;
            velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));
            ni.vol = velocity;
            if(ni.ains)
                noteUpdate(channel, i, Upd_Volume);
            return false;
        }
    }

    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    noteOff(channel, note, velocity != 0);
    // On Note on, Keyoff the note first, just in case keyoff
    // was omitted; this fixes Dance of sugar-plum fairy
    // by Microsoft. Now that we've done a Keyoff,
    // check if we still need to do a Keyon.
    // vol=0 and event 8x are both Keyoff-only.
    if(velocity == 0)
        return false;

    MIDIchannel &midiChan = m_midiChannels[channel];

    size_t midiins = midiChan.patch;
    bool isPercussion = (channel % 16 == 9) || midiChan.is_xg_percussion;

    size_t bank = 0;
    if(midiChan.bank_msb || midiChan.bank_lsb)
    {
        if((m_synthMode & Mode_GS) != 0) //in GS mode ignore LSB
            bank = (midiChan.bank_msb * 256);
        else
            bank = (midiChan.bank_msb * 256) + midiChan.bank_lsb;
    }

    if(isPercussion)
    {
        // == XG bank numbers ==
        // 0x7E00 - XG "SFX Kits" SFX1/SFX2 channel (16128 signed decimal)
        // 0x7F00 - XG "Drum Kits" Percussion channel (16256 signed decimal)

        // MIDI instrument defines the patch:
        if((m_synthMode & Mode_XG) != 0)
        {
            // Let XG SFX1/SFX2 bank will go in 128...255 range of LSB in WOPN file)
            // Let XG Percussion bank will use (0...127 LSB range in WOPN file)

            // Choose: SFX or Drum Kits
            bank = midiins + ((midiChan.bank_msb == 0x7E) ? 128 : 0);
        }
        else
        {
            bank = midiins;
        }
        midiins = note; // Percussion instrument
    }

    if(isPercussion)
        bank += Synth::PercussionTag;

    const OpnInstMeta *ains = &Synth::m_emptyInstrument;

    //Set bank bank
    const Synth::Bank *bnk = NULL;
    bool caughtMissingBank = false;
    if((bank & ~static_cast<uint16_t>(Synth::PercussionTag)) > 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
        else
            caughtMissingBank = true;
    }

    //Or fall back to bank ignoring LSB (GS/XG)
    if(ains->flags & OpnInstMeta::Flag_NoSound)
    {
        size_t fallback = bank & ~(size_t)0x7F;
        if(fallback != bank)
        {
            Synth::BankMap::iterator b = synth.m_insBanks.find(fallback);
            caughtMissingBank = false;
            if(b != synth.m_insBanks.end())
                bnk = &b->second;
            if(bnk)
                ains = &bnk->ins[midiins];
            else
                caughtMissingBank = true;
        }
    }

    if(caughtMissingBank && hooks.onDebugMessage)
    {
        std::set<size_t> &missing = (isPercussion) ?
                                    caugh_missing_banks_percussion : caugh_missing_banks_melodic;
        const char *text = (isPercussion) ?
                           "percussion" : "melodic";
        if(missing.insert(bank).second)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "[%i] Playing missing %s MIDI bank %i (patch %i)",
                                 channel, text, (bank & ~static_cast<uint16_t>(Synth::PercussionTag)), midiins);
        }
    }

    //Or fall back to first bank
    if((ains->flags & OpnInstMeta::Flag_NoSound) != 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank & Synth::PercussionTag);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
    }

    const int veloffset = ains->midiVelocityOffset;
    velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));

    int32_t tone = note;
    if(!isPercussion && (bank > 0)) // For non-zero banks
    {
        if(ains->flags & OpnInstMeta::Flag_NoSound)
        {
            if(hooks.onDebugMessage)
            {
                if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)))
                {
                    hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u", channel, midiChan.patch, midiins, bank);
                    caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
                }
            }
            bank = 0;
            midiins = midiChan.patch;
        }
    }

    if(ains->drumTone)
    {
        if(ains->drumTone >= 128)
            tone = ains->drumTone - 128;
        else
            tone = ains->drumTone;
    }

    MIDIchannel::NoteInfo::Phys voices[MIDIchannel::NoteInfo::MaxNumPhysChans] = {
        {0, ains->op[0], /*false*/},
        {0, ains->op[1], /*pseudo_4op*/},
    };
    //bool pseudo_4op = ains.flags & opnInstMeta::Flag_Pseudo8op;
    //if((opn.AdlPercussionMode == 1) && PercussionMap[midiins & 0xFF]) i[1] = i[0];

    bool isBlankNote = (ains->flags & OpnInstMeta::Flag_NoSound) != 0;

    if(hooks.onDebugMessage)
    {
        if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)) && isBlankNote)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Playing missing instrument %i", channel, midiins);
            caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
        }
    }

    if(isBlankNote)
    {
        // Don't even try to play the blank instrument! But, insert the dummy note.
        MIDIchannel::notes_iterator i = midiChan.ensure_find_or_create_activenote(note);
        MIDIchannel::NoteInfo &dummy = i->value;
        dummy.isBlank = true;
        dummy.isOnExtendedLifeTime = false;
        dummy.ttl = 0;
        dummy.ains = NULL;
        dummy.chip_channels_count = 0;
        // Record the last note on MIDI channel as source of portamento
        midiChan.portamentoSource = static_cast<int8_t>(note);
        return false;
    }

    // Allocate OPN2 channel (the physical sound channel for the note)
    int32_t adlchannel[MIDIchannel::NoteInfo::MaxNumPhysChans] = { -1, -1 };

    for(uint32_t ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        if(ccount == 1)
        {
            if(voices[0] == voices[1])
                break; // No secondary channel
            if(adlchannel[0] == -1)
                break; // No secondary if primary failed
        }

        int32_t c = -1;
        int32_t bs = -0x7FFFFFFFl;

        for(size_t a = 0; a < static_cast<size_t>(synth.m_numChannels); ++a)
        {
            if(ccount == 1 && static_cast<int32_t>(a) == adlchannel[0]) continue;
            // ^ Don't use the same channel for primary&secondary
            // ===== Kept for future pseudo-8-op mode
            //if(voices[0] == voices[1] || pseudo_4op)
            //{
            //    // Only use regular channels
            //    uint8_t expected_mode = 0;
            //    if(opn.AdlPercussionMode == 1)
            //    {
            //        if(cmf_percussion_mode)
            //            expected_mode = MidCh < 11 ? 0 : (3 + MidCh - 11); // CMF
            //        else
            //            expected_mode = PercussionMap[midiins & 0xFF];
            //    }
            //    if(opn.four_op_category[a] != expected_mode)
            //        continue;
            //}
            int64_t s = calculateChipChannelGoodness(a, voices[ccount]);
            if(s > bs)
            {
                bs = static_cast<int32_t>(s);    // Best candidate wins
                c = static_cast<int32_t>(a);
            }
        }

        if(c < 0)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                     "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",
                                     bank, midiChan.patch, note, channel);
            continue; // Could not play this note. Ignore it.
        }

        prepareChipChannelForNewNote(static_cast<size_t>(c), voices[ccount]);
        adlchannel[ccount] = c;
    }

    if(adlchannel[0] < 0 && adlchannel[1] < 0)
    {
        // The note could not be played, at all.
        return false;
    }

    //if(hooks.onDebugMessage)
    //    hooks.onDebugMessage(hooks.onDebugMessage_userData, "i1=%d:%d, i2=%d:%d", i[0],adlchannel[0], i[1],adlchannel[1]);

    if(midiChan.softPedal) // Apply Soft Pedal level reducing
        velocity = static_cast<uint8_t>(std::floor(static_cast<float>(velocity) * 0.8f));

    // Allocate active note for MIDI channel
    MIDIchannel::notes_iterator ir = midiChan.ensure_find_or_create_activenote(note);
    MIDIchannel::NoteInfo &ni = ir->value;
    ni.vol     = velocity;
    ni.vibrato = midiChan.noteAftertouch[note];
    ni.noteTone = static_cast<int16_t>(tone);
    ni.currentTone = tone;
    ni.glideRate = HUGE_VAL;
    ni.midiins = midiins;
    ni.isPercussion = isPercussion;
    ni.isBlank = isBlankNote;
    ni.isOnExtendedLifeTime = false;
    ni.ttl = 0;
    ni.ains = ains;
    ni.chip_channels_count = 0;

    int8_t currentPortamentoSource = midiChan.portamentoSource;
    double currentPortamentoRate = midiChan.portamentoRate;
    bool portamentoEnable =
        midiChan.portamentoEnable && currentPortamentoRate != HUGE_VAL && !isPercussion;
    // Record the last note on MIDI channel as source of portamento
    midiChan.portamentoSource = static_cast<int8_t>(note);
    // midiChan.portamentoSource = portamentoEnable ? (int8_t)note : (int8_t)-1;

    // Enable gliding on portamento note
    if (portamentoEnable && currentPortamentoSource >= 0)
    {
        ni.currentTone = currentPortamentoSource;
        ni.glideRate = currentPortamentoRate;
        ++midiChan.gliding_note_count;
    }

    // Enable life time extension on percussion note
    if (isPercussion)
    {
        ni.ttl = drum_note_min_time;
        ++midiChan.extended_note_count;
    }

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        uint16_t chipChan = static_cast<uint16_t>(adlchannel[ccount]);
        ni.phys_ensure_find_or_create(chipChan)->assign(voices[ccount]);
    }

    noteUpdate(channel, ir, Upd_All | Upd_Patch);

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        m_chipChannels[c].recent_ins = voices[ccount];
        m_chipChannels[c].addAge(0);
    }

    return true;
}